

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenInitializer::ConfigFileNamesAndGenex
          (cmQtAutoGenInitializer *this,ConfigString *configString,string *genex,string_view prefix,
          string_view suffix)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined8 local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  ConfigFileNames(this,configString,prefix,suffix);
  if (this->MultiConfig == true) {
    local_50 = 10;
    local_48 = "_$<CONFIG>";
    local_40 = suffix._M_len;
    local_38 = suffix._M_str;
    views._M_len = 3;
    views._M_array = &local_60;
    local_60._M_len = prefix._M_len;
    local_60._M_str = prefix._M_str;
    cmCatViews_abi_cxx11_(&local_80,views);
    std::__cxx11::string::operator=((string *)genex,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__cxx11::string::_M_assign((string *)genex);
  return;
}

Assistant:

void cmQtAutoGenInitializer::ConfigFileNamesAndGenex(
  ConfigString& configString, std::string& genex, cm::string_view const prefix,
  cm::string_view const suffix)
{
  this->ConfigFileNames(configString, prefix, suffix);
  if (this->MultiConfig) {
    genex = cmStrCat(prefix, "_$<CONFIG>"_s, suffix);
  } else {
    genex = configString.Default;
  }
}